

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha256_hash(uchar *data,unsigned_long len,sha256_ctx *ctx)

{
  uint uVar1;
  __uint32_t _Var2;
  int iVar3;
  sha256_ctx *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  int _i;
  uchar *sp;
  sha2_32t space;
  sha2_32t pos;
  int local_2c;
  void *local_28;
  uint local_20;
  uint local_1c;
  ulong local_10;
  
  local_1c = in_RDX->count[0] & 0x3f;
  local_20 = 0x40 - local_1c;
  uVar1 = in_RDX->count[0] + (int)in_RSI;
  in_RDX->count[0] = uVar1;
  local_28 = in_RDI;
  local_10 = in_RSI;
  if (uVar1 < in_RSI) {
    in_RDX->count[1] = in_RDX->count[1] + 1;
  }
  while (local_20 <= local_10) {
    memcpy((void *)((long)in_RDX->wbuf + (ulong)local_1c),local_28,(ulong)local_20);
    local_28 = (void *)((long)local_28 + (ulong)local_20);
    local_10 = local_10 - local_20;
    local_20 = 0x40;
    local_1c = 0;
    local_2c = 0x10;
    while (iVar3 = local_2c + -1, local_2c != 0) {
      _Var2 = __bswap_32(in_RDX->wbuf[iVar3]);
      in_RDX->wbuf[iVar3] = _Var2;
      local_2c = iVar3;
    }
    sha256_compile(in_RDX);
  }
  memcpy((void *)((long)in_RDX->wbuf + (ulong)local_1c),local_28,local_10);
  return;
}

Assistant:

void sha256_hash(const unsigned char data[], unsigned long len, sha256_ctx ctx[1])
{   sha2_32t pos = (sha2_32t)(ctx->count[0] & SHA256_MASK), 
             space = SHA256_BLOCK_SIZE - pos;
    const unsigned char *sp = data;

    if((ctx->count[0] += len) < len)
        ++(ctx->count[1]);

    while(len >= space)     /* tranfer whole blocks while possible  */
    {
        memcpy(((unsigned char*)ctx->wbuf) + pos, sp, space);
        sp += space; len -= space; space = SHA256_BLOCK_SIZE; pos = 0; 
                bsw_32(ctx->wbuf, SHA256_BLOCK_SIZE >> 2)
        sha256_compile(ctx);
    }

    memcpy(((unsigned char*)ctx->wbuf) + pos, sp, len);
}